

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMeshAddDomains(FmsMesh mesh,char *domain_name,FmsInt num_domains,FmsDomain **domains)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  FmsInt FVar4;
  void *pvVar5;
  undefined8 *in_RCX;
  ulong in_RDX;
  char *in_RSI;
  ulong *in_RDI;
  FmsDomain domain;
  FmsInt i_1;
  char *domain_name_copy;
  FmsInt m_num_domains;
  FmsDomain *m_domains;
  FmsInt nc;
  FmsInt *domain_offsets;
  FmsInt i;
  char **domain_names;
  FmsInt num_domain_names;
  char **in_stack_ffffffffffffff90;
  ulong uVar6;
  char *in_stack_ffffffffffffff98;
  void *local_58;
  undefined8 *local_48;
  ulong local_40;
  void *local_38;
  
  if (in_RDI == (ulong *)0x0) {
    return 1;
  }
  if (in_RSI == (char *)0x0) {
    return 2;
  }
  if (in_RCX == (undefined8 *)0x0) {
    return 3;
  }
  uVar1 = in_RDI[8];
  local_38 = (void *)in_RDI[10];
  for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
    iVar3 = strcmp(in_RSI,*(char **)((long)local_38 + local_40 * 8));
    if (iVar3 == 0) {
      return 4;
    }
  }
  local_48 = (undefined8 *)in_RDI[9];
  FVar4 = NextPow2(uVar1 + 1);
  if (uVar1 <= FVar4 >> 1) {
    local_38 = realloc(local_38,FVar4 << 3);
    if (local_38 == (void *)0x0) {
      return 5;
    }
    in_RDI[10] = (ulong)local_38;
    local_48 = (undefined8 *)realloc(local_48,(FVar4 + 1) * 8);
    if (local_48 == (undefined8 *)0x0) {
      return 5;
    }
    *local_48 = 0;
    in_RDI[9] = (ulong)local_48;
  }
  local_58 = (void *)in_RDI[5];
  uVar2 = *in_RDI;
  if ((in_RDX != 0) && (FVar4 = NextPow2(uVar2 + in_RDX), uVar2 <= FVar4 >> 1)) {
    local_58 = realloc(local_58,FVar4 << 3);
    if (local_58 == (void *)0x0) {
      return 5;
    }
    in_RDI[5] = (ulong)local_58;
  }
  iVar3 = FmsCopyString(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if (iVar3 != 0) {
    return 5;
  }
  uVar6 = 0;
  while( true ) {
    if (in_RDX <= uVar6) {
      *(char **)((long)local_38 + uVar1 * 8) = in_stack_ffffffffffffff98;
      in_RDI[8] = uVar1 + 1;
      local_48[uVar1 + 1] = uVar2 + in_RDX;
      *in_RDI = uVar2 + in_RDX;
      *in_RCX = (void *)((long)local_58 + uVar2 * 8);
      return 0;
    }
    pvVar5 = calloc(1,0x138);
    if (pvVar5 == (void *)0x0) break;
    *(char **)((long)pvVar5 + 0x120) = in_stack_ffffffffffffff98;
    *(ulong *)((long)pvVar5 + 0x128) = uVar6;
    *(undefined8 *)((long)pvVar5 + 0x130) = 0x7f;
    *(void **)((long)local_58 + (uVar2 + uVar6) * 8) = pvVar5;
    uVar6 = uVar6 + 1;
  }
  while (uVar6 != 0) {
    uVar6 = uVar6 - 1;
    free(*(void **)((long)local_58 + (uVar2 + uVar6) * 8));
  }
  free(in_stack_ffffffffffffff98);
  return 5;
}

Assistant:

int FmsMeshAddDomains(FmsMesh mesh, const char *domain_name, FmsInt num_domains,
                      FmsDomain **domains) {
  if (!mesh) { E_RETURN(1); }
  if (!domain_name) { E_RETURN(2); }
  if (!domains) { E_RETURN(3); }
  FmsInt num_domain_names = mesh->num_domain_names;
  char **domain_names = mesh->domain_names;
  // Make sure the 'domain_name' is not already used
  for (FmsInt i = 0; i < num_domain_names; i++) {
    if (strcmp(domain_name, domain_names[i]) == 0) { E_RETURN(4); }
  }
  FmsInt *domain_offsets = mesh->domain_offsets;
  // Reallocate mesh->domain_names and mesh->domain_offsets, if necessary
  FmsInt nc = NextPow2(num_domain_names+1);
  if (num_domain_names <= nc/2) {
    domain_names = realloc(domain_names, nc*sizeof(*domain_names));
    if (domain_names == NULL) { E_RETURN(5); }
    mesh->domain_names = domain_names;
    domain_offsets = realloc(domain_offsets, (nc+1)*sizeof(FmsInt));
    if (domain_offsets == NULL) { E_RETURN(5); }
    domain_offsets[0] = 0;
    mesh->domain_offsets = domain_offsets;
  }
  FmsDomain *m_domains = mesh->domains;
  const FmsInt m_num_domains = mesh->num_domains;
  // Reallocate mesh->domains, if necessary
  if (num_domains != 0) {
    nc = NextPow2(m_num_domains + num_domains);
    if (m_num_domains <= nc/2) {
      m_domains = realloc(m_domains, nc*sizeof(FmsDomain));
      if (m_domains == NULL) { E_RETURN(5); }
      mesh->domains = m_domains;
    }
  }
  char *domain_name_copy;
  if (FmsCopyString(domain_name, &domain_name_copy)) { E_RETURN(5); }
  // On error, call free(domain_name_copy)
  for (FmsInt i = 0; i < num_domains; i++) {
    FmsDomain domain;
    domain = calloc(1, sizeof(*domain));
    if (domain == NULL) {
      while (i != 0) { free(m_domains[m_num_domains + (--i)]); }
      free(domain_name_copy);
      E_RETURN(5);
    }
    // Init the domain name, id, and dim
    domain->name = domain_name_copy;
    domain->id = i;
    domain->dim = FMS_INVALID_DIM;
    m_domains[m_num_domains + i] = domain;
  }
  domain_names[num_domain_names] = domain_name_copy;
  mesh->num_domain_names = ++num_domain_names;
  mesh->num_domains = domain_offsets[num_domain_names] = m_num_domains +
                      num_domains;
  *domains = m_domains + m_num_domains;
  return 0;
}